

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_basics.cpp
# Opt level: O3

bool Am_Check_One_Object_For_Inactive(Am_Object *object,Am_Slot_Key slot_for_inactive)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Value value;
  Am_Object cmd;
  Am_Value local_20;
  Am_Object local_10;
  
  local_20.type = 0;
  local_20.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar2 = Am_Object::Get(object,0x157,1);
  Am_Value::operator=(&local_20,pAVar2);
  bVar1 = Am_Value::Valid(&local_20);
  if (bVar1) {
    Am_Object::Am_Object(&local_10,&local_20);
    pAVar2 = Am_Object::Get(&local_10,slot_for_inactive,1);
    Am_Value::operator=(&local_20,pAVar2);
    bVar1 = Am_Value::Valid(&local_20);
    Am_Object::~Am_Object(&local_10);
    if (bVar1) {
      bVar1 = false;
      goto LAB_001ab95f;
    }
  }
  bVar1 = true;
LAB_001ab95f:
  Am_Value::~Am_Value(&local_20);
  return bVar1;
}

Assistant:

bool
Am_Check_One_Object_For_Inactive(Am_Object &object,
                                 Am_Slot_Key slot_for_inactive)
{
  Am_Value value;
  value = object.Peek(Am_INACTIVE_COMMANDS);
  if (value.Valid()) {
    Am_Object cmd = value;
    value = cmd.Peek(slot_for_inactive);
    if (value.Valid())
      return false;
  }
  return true; //if get here, all selected items are fine
}